

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O2

void p_error_set_last_net(pint code)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  *piVar1 = code;
  return;
}

Assistant:

P_LIB_API void
p_error_set_last_net (pint code)
{
#if defined (P_OS_WIN)
	WSASetLastError (code);
#elif defined (P_OS_OS2)
	P_UNUSED (code);
#else
	errno = code;
#endif
}